

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void getPixelColorsRGB8(uchar *buffer,size_t numpixels,uchar *in,LodePNGColorMode *mode)

{
  uchar uVar1;
  undefined1 uVar2;
  uint uVar3;
  size_t sStack_58;
  uint index_1;
  size_t j_1;
  uint index;
  uint value;
  size_t j;
  uchar *puStack_38;
  uint highest;
  size_t i;
  LodePNGColorMode *pLStack_28;
  uint num_channels;
  LodePNGColorMode *mode_local;
  uchar *in_local;
  size_t numpixels_local;
  uchar *buffer_local;
  
  i._4_4_ = 3;
  pLStack_28 = mode;
  mode_local = (LodePNGColorMode *)in;
  in_local = (uchar *)numpixels;
  numpixels_local = (size_t)buffer;
  if (mode->colortype == LCT_GREY) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        numpixels_local = numpixels_local + 3;
      }
    }
    else if (mode->bitdepth == 0x10) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38 * 2];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        numpixels_local = numpixels_local + 3;
      }
    }
    else {
      j._4_4_ = (1 << ((byte)mode->bitdepth & 0x1f)) - 1;
      _index = 0;
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        j_1._4_4_ = readBitsFromReversedStream
                              ((size_t *)&index,(uchar *)mode_local,(ulong)pLStack_28->bitdepth);
        uVar2 = (undefined1)((j_1._4_4_ * 0xff) / j._4_4_);
        *(undefined1 *)(numpixels_local + 2) = uVar2;
        *(undefined1 *)(numpixels_local + 1) = uVar2;
        *(undefined1 *)numpixels_local = uVar2;
        numpixels_local = numpixels_local + 3;
      }
    }
  }
  else if (mode->colortype == LCT_RGB) {
    if (mode->bitdepth == 8) {
      lodepng_memcpy(buffer,in,numpixels * 3);
    }
    else {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        *(uchar *)numpixels_local = in[(long)puStack_38 * 6];
        *(uchar *)(numpixels_local + 1) = in[(long)puStack_38 * 6 + 2];
        *(uchar *)(numpixels_local + 2) = in[(long)puStack_38 * 6 + 4];
        numpixels_local = numpixels_local + 3;
      }
    }
  }
  else if (mode->colortype == LCT_PALETTE) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        j_1._0_4_ = (uint)puStack_38[(long)&mode_local->colortype];
        lodepng_memcpy((void *)numpixels_local,
                       pLStack_28->palette + (ulong)puStack_38[(long)&mode_local->colortype] * 4,3);
        numpixels_local = numpixels_local + 3;
      }
    }
    else {
      sStack_58 = 0;
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        uVar3 = readBitsFromReversedStream
                          (&stack0xffffffffffffffa8,(uchar *)mode_local,(ulong)pLStack_28->bitdepth)
        ;
        lodepng_memcpy((void *)numpixels_local,pLStack_28->palette + (uVar3 << 2),3);
        numpixels_local = numpixels_local + 3;
      }
    }
  }
  else if (mode->colortype == LCT_GREY_ALPHA) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38 * 2];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        numpixels_local = numpixels_local + 3;
      }
    }
    else {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        uVar1 = in[(long)puStack_38 * 4];
        *(uchar *)(numpixels_local + 2) = uVar1;
        *(uchar *)(numpixels_local + 1) = uVar1;
        *(uchar *)numpixels_local = uVar1;
        numpixels_local = numpixels_local + 3;
      }
    }
  }
  else if (mode->colortype == LCT_RGBA) {
    if (mode->bitdepth == 8) {
      for (puStack_38 = (uchar *)0x0; puStack_38 != in_local; puStack_38 = puStack_38 + 1) {
        lodepng_memcpy((void *)numpixels_local,&mode_local->colortype + (long)puStack_38,3);
        numpixels_local = numpixels_local + 3;
      }
    }
    else {
      for (puStack_38 = (uchar *)0x0; puStack_38 != (uchar *)numpixels;
          puStack_38 = (uchar *)((long)puStack_38 + 1)) {
        *(uchar *)numpixels_local = in[(long)puStack_38 * 8];
        *(uchar *)(numpixels_local + 1) = in[(long)puStack_38 * 8 + 2];
        *(uchar *)(numpixels_local + 2) = in[(long)puStack_38 * 8 + 4];
        numpixels_local = numpixels_local + 3;
      }
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGB8(unsigned char* LODEPNG_RESTRICT buffer, size_t numpixels,
                               const unsigned char* LODEPNG_RESTRICT in,
                               const LodePNGColorMode* mode) {
  const unsigned num_channels = 3;
  size_t i;
  if(mode->colortype == LCT_GREY) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i];
      }
    } else if(mode->bitdepth == 16) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2];
      }
    } else {
      unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
        buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
      }
    }
  } else if(mode->colortype == LCT_RGB) {
    if(mode->bitdepth == 8) {
      lodepng_memcpy(buffer, in, numpixels * 3);
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 6 + 0];
        buffer[1] = in[i * 6 + 2];
        buffer[2] = in[i * 6 + 4];
      }
    }
  } else if(mode->colortype == LCT_PALETTE) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = in[i];
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 3);
      }
    } else {
      size_t j = 0;
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        unsigned index = readBitsFromReversedStream(&j, in, mode->bitdepth);
        /*out of bounds of palette not checked: see lodepng_color_mode_alloc_palette.*/
        lodepng_memcpy(buffer, &mode->palette[index * 4], 3);
      }
    }
  } else if(mode->colortype == LCT_GREY_ALPHA) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
      }
    }
  } else if(mode->colortype == LCT_RGBA) {
    if(mode->bitdepth == 8) {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        lodepng_memcpy(buffer, &in[i * 4], 3);
      }
    } else {
      for(i = 0; i != numpixels; ++i, buffer += num_channels) {
        buffer[0] = in[i * 8 + 0];
        buffer[1] = in[i * 8 + 2];
        buffer[2] = in[i * 8 + 4];
      }
    }
  }
}